

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout_p.h
# Opt level: O3

uint qConvertRgb64ToRgb30<(QtPixelOrder)1>(QRgba64 c)

{
  QRgba64 QVar1;
  long in_FS_OFFSET;
  QRgba64 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.rgba = c.rgba;
  if (1 < (ushort)((short)(c.rgba >> 0x30) + 1U)) {
    QVar1 = QRgba64::unpremultiplied(&local_20);
    local_20.rgba = (ulong)((uint)(c.rgba >> 0x3e) * 0x5555) << 0x30 | QVar1.rgba & 0xffffffffffff;
    c = QRgba64::premultiplied(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (uint)c.rgba >> 0xc & 0xffc00 |
           (uint)(c.rgba >> 0x12) & 0x3ff00000 | (uint)(c.rgba >> 0x20) & 0xc0000000 |
           (uint)(c.rgba >> 6) & 0x3ff;
  }
  __stack_chk_fail();
}

Assistant:

inline unsigned int qConvertRgb64ToRgb30<PixelOrderBGR>(QRgba64 c)
{
    c = qRepremultiply<14>(c);
    const uint a = c.alpha() >> 14;
    const uint r = c.red()   >> 6;
    const uint g = c.green() >> 6;
    const uint b = c.blue()  >> 6;
    return (a << 30) | (b << 20) | (g << 10) | r;
}